

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

void __thiscall wasm::OptimizeInstructions::canonicalize(OptimizeInstructions *this,Binary *binary)

{
  undefined1 auVar1 [16];
  Id IVar2;
  Id IVar3;
  Expression *pEVar4;
  Expression *pEVar5;
  Type TVar6;
  bool bVar7;
  BinaryOp BVar8;
  BinaryOp BVar9;
  int64_t iVar10;
  ulong uVar11;
  _func_int **pp_Var12;
  LocalGet *right;
  undefined1 auVar13 [16];
  OptimizeInstructions *local_78;
  anon_class_16_2_3610dbfc swap;
  anon_class_24_3_4a829d37 maybeSwap;
  Binary *local_38;
  Binary *binary_local;
  
  local_38 = binary;
  bVar7 = shouldCanonicalize(this,binary);
  if (!bVar7) {
    __assert_fail("shouldCanonicalize(binary)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                  ,0xa97,"void wasm::OptimizeInstructions::canonicalize(Binary *)");
  }
  maybeSwap.binary = (Binary **)&local_78;
  swap.this = (OptimizeInstructions *)&stack0xffffffffffffffc8;
  local_78 = this;
  swap.binary = (Binary **)this;
  maybeSwap.this = swap.this;
  if ((binary->left->_id == ConstId) && (binary->right->_id != ConstId)) {
    bVar7 = EffectAnalyzer::canReorder
                      (&((this->
                         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                         ).super_Pass.runner)->options,
                       (this->
                       super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                       ).
                       super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                       .
                       super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                       .currModule,binary->left,binary->right);
    if (!bVar7) {
      __assert_fail("canReorder(binary->left, binary->right)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                    ,0xa99,
                    "auto wasm::OptimizeInstructions::canonicalize(Binary *)::(anonymous class)::operator()() const"
                   );
    }
    bVar7 = Binary::isRelational
                      ((Binary *)
                       ((swap.this)->
                       super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                       ).super_Pass._vptr_Pass);
    pp_Var12 = ((swap.this)->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
               ).super_Pass._vptr_Pass;
    if (bVar7) {
      BVar8 = reverseRelationalOp(this,*(BinaryOp *)(pp_Var12 + 2));
      pp_Var12 = ((swap.this)->
                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                 ).super_Pass._vptr_Pass;
      *(BinaryOp *)(pp_Var12 + 2) = BVar8;
    }
    auVar1 = *(undefined1 (*) [16])(pp_Var12 + 3);
    auVar13._0_8_ = auVar1._8_8_;
    auVar13._8_4_ = auVar1._0_4_;
    auVar13._12_4_ = auVar1._4_4_;
    *(undefined1 (*) [16])(pp_Var12 + 3) = auVar13;
    binary = local_38;
  }
  pEVar4 = binary->right;
  IVar2 = pEVar4->_id;
  if (IVar2 != ConstId) {
    pEVar5 = binary->left;
    IVar3 = pEVar5->_id;
    if (IVar3 == LocalGetId) {
      if ((IVar2 == LocalGetId) && (*(uint *)(pEVar5 + 1) <= *(uint *)(pEVar4 + 1))) {
        return;
      }
    }
    else if (IVar3 == IVar2) {
      if ((IVar2 != BinaryId) && (IVar2 != UnaryId)) {
        return;
      }
      if (*(int *)(pEVar5 + 1) <= *(int *)(pEVar4 + 1)) {
        return;
      }
    }
    else if (IVar3 <= IVar2) {
      return;
    }
    canonicalize::anon_class_24_3_4a829d37::operator()((anon_class_24_3_4a829d37 *)&swap.binary);
    return;
  }
  uVar11 = (pEVar4->type).id;
  if (6 < uVar11) goto LAB_009d6cda;
  BVar8 = binary->op;
  if (BVar8 == *(BinaryOp *)(&DAT_00df92e4 + uVar11 * 4)) {
    Literal::neg((Literal *)&maybeSwap.swap,(Literal *)(pEVar4 + 1));
    Literal::operator=((Literal *)(pEVar4 + 1),(Literal *)&maybeSwap.swap);
    Literal::~Literal((Literal *)&maybeSwap.swap);
    uVar11 = (pEVar4->type).id;
    if (uVar11 < 7) {
      local_38->op = *(BinaryOp *)(&DAT_00df9300 + uVar11 * 4);
      return;
    }
    goto LAB_009d6cda;
  }
  if (BVar8 == *(BinaryOp *)(&DAT_00df905c + uVar11 * 4)) {
    iVar10 = Literal::getInteger((Literal *)(pEVar4 + 1));
    if (iVar10 == -1) {
      TVar6.id = (pEVar4->type).id;
      if (6 < TVar6.id) goto LAB_009d6cda;
      local_38->op = *(BinaryOp *)(&DAT_00df9040 + TVar6.id * 4);
      Literal::makeZero((Literal *)&maybeSwap.swap,TVar6);
      Literal::operator=((Literal *)(pEVar4 + 1),(Literal *)&maybeSwap.swap);
      goto LAB_009d6cc2;
    }
    uVar11 = (pEVar4->type).id;
    if (6 < uVar11) goto LAB_009d6cda;
    BVar8 = local_38->op;
    binary = local_38;
  }
  if (BVar8 == *(BinaryOp *)(&DAT_00df9024 + uVar11 * 4)) {
    iVar10 = Literal::getInteger((Literal *)(pEVar4 + 1));
    if (iVar10 == -1) {
      TVar6.id = (pEVar4->type).id;
      if (6 < TVar6.id) goto LAB_009d6cda;
      local_38->op = *(BinaryOp *)(&DAT_00df9008 + TVar6.id * 4);
      Literal::makeZero((Literal *)&maybeSwap.swap,TVar6);
      Literal::operator=((Literal *)(pEVar4 + 1),(Literal *)&maybeSwap.swap);
      goto LAB_009d6cc2;
    }
    uVar11 = (pEVar4->type).id;
    if (6 < uVar11) goto LAB_009d6cda;
    BVar8 = local_38->op;
    binary = local_38;
  }
  if (BVar8 == *(BinaryOp *)(&DAT_00df9008 + (long)(int)uVar11 * 4)) {
    iVar10 = Literal::getInteger((Literal *)(pEVar4 + 1));
    if (iVar10 == 1) {
      TVar6.id = (pEVar4->type).id;
      if (6 < TVar6.id) goto LAB_009d6cda;
      local_38->op = *(BinaryOp *)(&DAT_00df9024 + TVar6.id * 4);
      Literal::makeZero((Literal *)&maybeSwap.swap,TVar6);
      Literal::operator=((Literal *)(pEVar4 + 1),(Literal *)&maybeSwap.swap);
      goto LAB_009d6cc2;
    }
    uVar11 = (pEVar4->type).id;
    if (6 < uVar11) goto LAB_009d6cda;
    BVar8 = local_38->op;
    binary = local_38;
  }
  if (BVar8 == *(BinaryOp *)(&DAT_00df9040 + (long)(int)uVar11 * 4)) {
    iVar10 = Literal::getInteger((Literal *)(pEVar4 + 1));
    if (iVar10 == 1) {
      TVar6.id = (pEVar4->type).id;
      if (6 < TVar6.id) goto LAB_009d6cda;
      local_38->op = *(BinaryOp *)(&DAT_00df905c + TVar6.id * 4);
      Literal::makeZero((Literal *)&maybeSwap.swap,TVar6);
      Literal::operator=((Literal *)(pEVar4 + 1),(Literal *)&maybeSwap.swap);
      goto LAB_009d6cc2;
    }
    uVar11 = (pEVar4->type).id;
    if (6 < uVar11) goto LAB_009d6cda;
    BVar8 = local_38->op;
    binary = local_38;
  }
  if (BVar8 == *(BinaryOp *)(&DAT_00df9078 + (long)(int)uVar11 * 4)) {
    iVar10 = Literal::getInteger((Literal *)(pEVar4 + 1));
    if (iVar10 == 1) {
      TVar6.id = (pEVar4->type).id;
      if (6 < TVar6.id) goto LAB_009d6cda;
      local_38->op = *(BinaryOp *)(&DAT_00df9190 + TVar6.id * 4);
      Literal::makeZero((Literal *)&maybeSwap.swap,TVar6);
      Literal::operator=((Literal *)(pEVar4 + 1),(Literal *)&maybeSwap.swap);
      goto LAB_009d6cc2;
    }
    uVar11 = (pEVar4->type).id;
    if (6 < uVar11) goto LAB_009d6cda;
    BVar8 = local_38->op;
    binary = local_38;
  }
  if (BVar8 == *(BinaryOp *)(&DAT_00df9094 + (long)(int)uVar11 * 4)) {
    iVar10 = Literal::getInteger((Literal *)(pEVar4 + 1));
    if (iVar10 == 1) {
      TVar6.id = (pEVar4->type).id;
      if (6 < TVar6.id) {
LAB_009d6cda:
        __assert_fail("isBasic() && \"Basic type expected\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                      ,0x1c4,"BasicType wasm::Type::getBasic() const");
      }
      local_38->op = *(BinaryOp *)(&DAT_00df9174 + TVar6.id * 4);
      Literal::makeZero((Literal *)&maybeSwap.swap,TVar6);
      Literal::operator=((Literal *)(pEVar4 + 1),(Literal *)&maybeSwap.swap);
      goto LAB_009d6cc2;
    }
    BVar8 = local_38->op;
    binary = local_38;
  }
  switch(BVar8) {
  case LtSInt32:
    if (*(long *)(pEVar4 + 2) != 2) {
LAB_009d6d37:
      __assert_fail("type == Type::i32",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x120,"int32_t wasm::Literal::geti32() const");
    }
    if ((((Literal *)(pEVar4 + 1))->field_0).i32 == -0x7fffffff) {
      binary->op = EqInt32;
      Literal::makeSignedMin((Literal *)&maybeSwap.swap,(Type)0x2);
      Literal::operator=((Literal *)(pEVar4 + 1),(Literal *)&maybeSwap.swap);
      goto LAB_009d6cc2;
    }
    break;
  case LtUInt32:
  case LeUInt32:
  case GtUInt32:
    break;
  case LeSInt32:
    if (*(long *)(pEVar4 + 2) != 2) goto LAB_009d6d37;
    if ((((Literal *)(pEVar4 + 1))->field_0).i32 == 0x7ffffffe) {
      binary->op = NeInt32;
      Literal::makeSignedMax((Literal *)&maybeSwap.swap,(Type)0x2);
      Literal::operator=((Literal *)(pEVar4 + 1),(Literal *)&maybeSwap.swap);
      goto LAB_009d6cc2;
    }
    break;
  case GtSInt32:
    if (*(long *)(pEVar4 + 2) != 2) goto LAB_009d6d37;
    if ((((Literal *)(pEVar4 + 1))->field_0).i32 == 0x7ffffffe) {
      binary->op = EqInt32;
      Literal::makeSignedMax((Literal *)&maybeSwap.swap,(Type)0x2);
      Literal::operator=((Literal *)(pEVar4 + 1),(Literal *)&maybeSwap.swap);
      goto LAB_009d6cc2;
    }
    break;
  case GeSInt32:
    if (*(long *)(pEVar4 + 2) != 2) goto LAB_009d6d37;
    if ((((Literal *)(pEVar4 + 1))->field_0).i32 == -0x7fffffff) {
      binary->op = NeInt32;
      Literal::makeSignedMin((Literal *)&maybeSwap.swap,(Type)0x2);
      Literal::operator=((Literal *)(pEVar4 + 1),(Literal *)&maybeSwap.swap);
      goto LAB_009d6cc2;
    }
    break;
  default:
    switch(BVar8) {
    case LtSInt64:
      if (*(long *)(pEVar4 + 2) != 3) {
LAB_009d6d56:
        __assert_fail("type == Type::i64",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                      ,0x129,"int64_t wasm::Literal::geti64() const");
      }
      if ((((Literal *)(pEVar4 + 1))->field_0).i64 == -0x7fffffffffffffff) {
        binary->op = EqInt64;
        Literal::makeSignedMin((Literal *)&maybeSwap.swap,(Type)0x3);
        Literal::operator=((Literal *)(pEVar4 + 1),(Literal *)&maybeSwap.swap);
        goto LAB_009d6cc2;
      }
      break;
    case LeSInt64:
      if (*(long *)(pEVar4 + 2) != 3) goto LAB_009d6d56;
      if ((((Literal *)(pEVar4 + 1))->field_0).i64 == 0x7ffffffffffffffe) {
        binary->op = NeInt64;
        Literal::makeSignedMax((Literal *)&maybeSwap.swap,(Type)0x3);
        Literal::operator=((Literal *)(pEVar4 + 1),(Literal *)&maybeSwap.swap);
        goto LAB_009d6cc2;
      }
      break;
    case GtSInt64:
      if (*(long *)(pEVar4 + 2) != 3) goto LAB_009d6d56;
      if ((((Literal *)(pEVar4 + 1))->field_0).i64 == 0x7ffffffffffffffe) {
        binary->op = EqInt64;
        Literal::makeSignedMax((Literal *)&maybeSwap.swap,(Type)0x3);
        Literal::operator=((Literal *)(pEVar4 + 1),(Literal *)&maybeSwap.swap);
        goto LAB_009d6cc2;
      }
      break;
    case GeSInt64:
      if (*(long *)(pEVar4 + 2) != 3) goto LAB_009d6d56;
      if ((((Literal *)(pEVar4 + 1))->field_0).i64 == -0x7fffffffffffffff) {
        binary->op = NeInt64;
        Literal::makeSignedMin((Literal *)&maybeSwap.swap,(Type)0x3);
        Literal::operator=((Literal *)(pEVar4 + 1),(Literal *)&maybeSwap.swap);
        goto LAB_009d6cc2;
      }
    }
  }
  BVar9 = Abstract::getBinary((Type)(pEVar4->type).id,LeU);
  if (BVar8 == BVar9) {
    iVar10 = Literal::getInteger((Literal *)(pEVar4 + 1));
    if (iVar10 == -2) {
      BVar8 = Abstract::getBinary((Type)(pEVar4->type).id,Ne);
      local_38->op = BVar8;
      Literal::makeUnsignedMax((Literal *)&maybeSwap.swap,(Type)(pEVar4->type).id);
      Literal::operator=((Literal *)(pEVar4 + 1),(Literal *)&maybeSwap.swap);
      goto LAB_009d6cc2;
    }
  }
  BVar8 = local_38->op;
  BVar9 = Abstract::getBinary((Type)(pEVar4->type).id,GtU);
  if (BVar8 != BVar9) {
    return;
  }
  iVar10 = Literal::getInteger((Literal *)(pEVar4 + 1));
  if (iVar10 != -2) {
    return;
  }
  BVar8 = Abstract::getBinary((Type)(pEVar4->type).id,Eq);
  local_38->op = BVar8;
  Literal::makeUnsignedMax((Literal *)&maybeSwap.swap,(Type)(pEVar4->type).id);
  Literal::operator=((Literal *)(pEVar4 + 1),(Literal *)&maybeSwap.swap);
LAB_009d6cc2:
  Literal::~Literal((Literal *)&maybeSwap.swap);
  return;
}

Assistant:

void canonicalize(Binary* binary) {
    assert(shouldCanonicalize(binary));
    auto swap = [&]() {
      assert(canReorder(binary->left, binary->right));
      if (binary->isRelational()) {
        binary->op = reverseRelationalOp(binary->op);
      }
      std::swap(binary->left, binary->right);
    };
    auto maybeSwap = [&]() {
      if (canReorder(binary->left, binary->right)) {
        swap();
      }
    };
    // Prefer a const on the right.
    if (binary->left->is<Const>() && !binary->right->is<Const>()) {
      swap();
    }
    if (auto* c = binary->right->dynCast<Const>()) {
      // x - C   ==>   x + (-C)
      // Prefer use addition if there is a constant on the right.
      if (binary->op == Abstract::getBinary(c->type, Abstract::Sub)) {
        c->value = c->value.neg();
        binary->op = Abstract::getBinary(c->type, Abstract::Add);
        return;
      }
      // Prefer to compare to 0 instead of to -1 or 1.
      // (signed)x > -1   ==>   x >= 0
      if (binary->op == Abstract::getBinary(c->type, Abstract::GtS) &&
          c->value.getInteger() == -1LL) {
        binary->op = Abstract::getBinary(c->type, Abstract::GeS);
        c->value = Literal::makeZero(c->type);
        return;
      }
      // (signed)x <= -1   ==>   x < 0
      if (binary->op == Abstract::getBinary(c->type, Abstract::LeS) &&
          c->value.getInteger() == -1LL) {
        binary->op = Abstract::getBinary(c->type, Abstract::LtS);
        c->value = Literal::makeZero(c->type);
        return;
      }
      // (signed)x < 1   ==>   x <= 0
      if (binary->op == Abstract::getBinary(c->type, Abstract::LtS) &&
          c->value.getInteger() == 1LL) {
        binary->op = Abstract::getBinary(c->type, Abstract::LeS);
        c->value = Literal::makeZero(c->type);
        return;
      }
      // (signed)x >= 1   ==>   x > 0
      if (binary->op == Abstract::getBinary(c->type, Abstract::GeS) &&
          c->value.getInteger() == 1LL) {
        binary->op = Abstract::getBinary(c->type, Abstract::GtS);
        c->value = Literal::makeZero(c->type);
        return;
      }
      // (unsigned)x < 1   ==>   x == 0
      if (binary->op == Abstract::getBinary(c->type, Abstract::LtU) &&
          c->value.getInteger() == 1LL) {
        binary->op = Abstract::getBinary(c->type, Abstract::Eq);
        c->value = Literal::makeZero(c->type);
        return;
      }
      // (unsigned)x >= 1   ==>   x != 0
      if (binary->op == Abstract::getBinary(c->type, Abstract::GeU) &&
          c->value.getInteger() == 1LL) {
        binary->op = Abstract::getBinary(c->type, Abstract::Ne);
        c->value = Literal::makeZero(c->type);
        return;
      }
      // Prefer compare to signed min (s_min) instead of s_min + 1.
      // (signed)x < s_min + 1   ==>   x == s_min
      if (binary->op == LtSInt32 && c->value.geti32() == INT32_MIN + 1) {
        binary->op = EqInt32;
        c->value = Literal::makeSignedMin(Type::i32);
        return;
      }
      if (binary->op == LtSInt64 && c->value.geti64() == INT64_MIN + 1) {
        binary->op = EqInt64;
        c->value = Literal::makeSignedMin(Type::i64);
        return;
      }
      // (signed)x >= s_min + 1   ==>   x != s_min
      if (binary->op == GeSInt32 && c->value.geti32() == INT32_MIN + 1) {
        binary->op = NeInt32;
        c->value = Literal::makeSignedMin(Type::i32);
        return;
      }
      if (binary->op == GeSInt64 && c->value.geti64() == INT64_MIN + 1) {
        binary->op = NeInt64;
        c->value = Literal::makeSignedMin(Type::i64);
        return;
      }
      // Prefer compare to signed max (s_max) instead of s_max - 1.
      // (signed)x > s_max - 1   ==>   x == s_max
      if (binary->op == GtSInt32 && c->value.geti32() == INT32_MAX - 1) {
        binary->op = EqInt32;
        c->value = Literal::makeSignedMax(Type::i32);
        return;
      }
      if (binary->op == GtSInt64 && c->value.geti64() == INT64_MAX - 1) {
        binary->op = EqInt64;
        c->value = Literal::makeSignedMax(Type::i64);
        return;
      }
      // (signed)x <= s_max - 1   ==>   x != s_max
      if (binary->op == LeSInt32 && c->value.geti32() == INT32_MAX - 1) {
        binary->op = NeInt32;
        c->value = Literal::makeSignedMax(Type::i32);
        return;
      }
      if (binary->op == LeSInt64 && c->value.geti64() == INT64_MAX - 1) {
        binary->op = NeInt64;
        c->value = Literal::makeSignedMax(Type::i64);
        return;
      }
      // Prefer compare to unsigned max (u_max) instead of u_max - 1.
      // (unsigned)x <= u_max - 1   ==>   x != u_max
      if (binary->op == Abstract::getBinary(c->type, Abstract::LeU) &&
          c->value.getInteger() == (int64_t)(UINT64_MAX - 1)) {
        binary->op = Abstract::getBinary(c->type, Abstract::Ne);
        c->value = Literal::makeUnsignedMax(c->type);
        return;
      }
      // (unsigned)x > u_max - 1   ==>   x == u_max
      if (binary->op == Abstract::getBinary(c->type, Abstract::GtU) &&
          c->value.getInteger() == (int64_t)(UINT64_MAX - 1)) {
        binary->op = Abstract::getBinary(c->type, Abstract::Eq);
        c->value = Literal::makeUnsignedMax(c->type);
        return;
      }
      return;
    }
    // Prefer a get on the right.
    if (binary->left->is<LocalGet>() && !binary->right->is<LocalGet>()) {
      return maybeSwap();
    }
    // Sort by the node id type, if different.
    if (binary->left->_id != binary->right->_id) {
      if (binary->left->_id > binary->right->_id) {
        return maybeSwap();
      }
      return;
    }
    // If the children have the same node id, we have to go deeper.
    if (auto* left = binary->left->dynCast<Unary>()) {
      auto* right = binary->right->cast<Unary>();
      if (left->op > right->op) {
        return maybeSwap();
      }
    }
    if (auto* left = binary->left->dynCast<Binary>()) {
      auto* right = binary->right->cast<Binary>();
      if (left->op > right->op) {
        return maybeSwap();
      }
    }
    if (auto* left = binary->left->dynCast<LocalGet>()) {
      auto* right = binary->right->cast<LocalGet>();
      if (left->index > right->index) {
        return maybeSwap();
      }
    }
  }